

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConnection.cpp
# Opt level: O0

void __thiscall
FIX::HttpConnection::processRefreshSessions
          (HttpConnection *this,HttpMessage *request,stringstream *h,stringstream *b)

{
  bool bVar1;
  string *__lhs;
  reference sessionID;
  Session *this_00;
  ostream *poVar2;
  TAG *pTVar3;
  bool local_1022;
  exception *e;
  string local_1008;
  allocator<char> local_fe1;
  string local_fe0;
  undefined1 local_fc0 [8];
  A a_2;
  string local_e00;
  string local_de0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_dc0;
  undefined1 local_da0 [8];
  A a_1;
  CENTER center_2;
  H2 h2_1;
  CENTER center_1;
  string local_6b8;
  allocator<char> local_691;
  string local_690;
  undefined1 local_670 [8];
  A a;
  H2 h2;
  CENTER center;
  string local_140;
  _Self local_120;
  _Base_ptr local_118;
  _Rb_tree_const_iterator<FIX::SessionID> local_110;
  iterator session;
  set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> sessions;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  byte local_85;
  bool confirm;
  undefined1 local_78 [8];
  HttpMessage copy;
  stringstream *b_local;
  stringstream *h_local;
  HttpMessage *request_local;
  HttpConnection *this_local;
  
  copy.m_parameters._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)b;
  HttpMessage::HttpMessage((HttpMessage *)local_78,request);
  local_85 = 0;
  std::allocator<char>::allocator();
  sessions._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = 0;
  sessions._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_ = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"confirm",&local_a9);
  bVar1 = HttpMessage::hasParameter((HttpMessage *)local_78,&local_a8);
  local_1022 = false;
  if (bVar1) {
    std::allocator<char>::allocator();
    sessions._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"confirm",
               (allocator<char> *)
               ((long)&sessions._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
    sessions._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_ = 1;
    __lhs = HttpMessage::getParameter((HttpMessage *)local_78,&local_d0);
    local_1022 = std::operator!=(__lhs,"0");
  }
  if ((sessions._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_ & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_d0);
  }
  if ((sessions._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ & 1) != 0) {
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&sessions._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  }
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  if (local_1022 != false) {
    local_85 = 1;
    Session::getSessions();
    std::_Rb_tree_const_iterator<FIX::SessionID>::_Rb_tree_const_iterator(&local_110);
    local_118 = (_Base_ptr)
                std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
                ::begin((set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
                         *)&session);
    local_110._M_node = local_118;
    while( true ) {
      local_120._M_node =
           (_Base_ptr)
           std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::end
                     ((set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
                       *)&session);
      bVar1 = std::operator!=(&local_110,&local_120);
      if (!bVar1) break;
      sessionID = std::_Rb_tree_const_iterator<FIX::SessionID>::operator*(&local_110);
      this_00 = Session::lookupSession(sessionID);
      Session::refresh(this_00);
      std::_Rb_tree_const_iterator<FIX::SessionID>::operator++(&local_110);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_140,"confirm",
               (allocator<char> *)((long)&center.super_TAG.m_stream + 7));
    HttpMessage::removeParameter((HttpMessage *)local_78,&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    std::allocator<char>::~allocator((allocator<char> *)((long)&center.super_TAG.m_stream + 7));
    std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::~set
              ((set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> *)
               &session);
  }
  if ((local_85 & 1) == 0) {
    HTML::CENTER::CENTER
              ((CENTER *)&h2_1.super_TAG.m_stream,
               (ostream *)
               (copy.m_parameters._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x10));
    HTML::TAG::text((TAG *)&h2_1.super_TAG.m_stream);
    HTML::H2::H2((H2 *)&center_2.super_TAG.m_stream,
                 (ostream *)
                 (copy.m_parameters._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x10));
    HTML::TAG::text((TAG *)&center_2.super_TAG.m_stream);
    std::operator<<((ostream *)
                    (copy.m_parameters._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x10),
                    "Are you sure you want to refresh all sessions ?");
    HTML::H2::~H2((H2 *)&center_2.super_TAG.m_stream);
    HTML::CENTER::~CENTER((CENTER *)&h2_1.super_TAG.m_stream);
    HTML::CENTER::CENTER
              ((CENTER *)&a_1.super_TAG.m_stream,
               (ostream *)
               (copy.m_parameters._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x10));
    HTML::TAG::text((TAG *)&a_1.super_TAG.m_stream);
    std::operator<<((ostream *)
                    (copy.m_parameters._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x10),"[")
    ;
    HTML::A::A((A *)local_da0,
               (ostream *)
               (copy.m_parameters._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x10));
    HttpMessage::toString_abi_cxx11_(&local_de0,request);
    std::operator+(&local_dc0,&local_de0,"?confirm=1");
    pTVar3 = &HTML::A::href((A *)local_da0,&local_dc0)->super_TAG;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e00,"YES, refresh sessions",
               (allocator<char> *)((long)&a_2.super_TAG.m_stream + 7));
    HTML::TAG::text(pTVar3,&local_e00);
    std::__cxx11::string::~string((string *)&local_e00);
    std::allocator<char>::~allocator((allocator<char> *)((long)&a_2.super_TAG.m_stream + 7));
    std::__cxx11::string::~string((string *)&local_dc0);
    std::__cxx11::string::~string((string *)&local_de0);
    HTML::A::~A((A *)local_da0);
    poVar2 = std::operator<<((ostream *)
                             (copy.m_parameters._M_t._M_impl.super__Rb_tree_header._M_node_count +
                             0x10),"]");
    poVar2 = std::operator<<(poVar2,HTML::NBSP);
    std::operator<<(poVar2,"[");
    HTML::A::A((A *)local_fc0,
               (ostream *)
               (copy.m_parameters._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x10));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_fe0,"/",&local_fe1);
    pTVar3 = &HTML::A::href((A *)local_fc0,&local_fe0)->super_TAG;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1008,"NO, do not refresh sessions",(allocator<char> *)((long)&e + 7)
              );
    HTML::TAG::text(pTVar3,&local_1008);
    std::__cxx11::string::~string((string *)&local_1008);
    std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
    std::__cxx11::string::~string((string *)&local_fe0);
    std::allocator<char>::~allocator(&local_fe1);
    HTML::A::~A((A *)local_fc0);
    std::operator<<((ostream *)
                    (copy.m_parameters._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x10),"]")
    ;
    HTML::CENTER::~CENTER((CENTER *)&a_1.super_TAG.m_stream);
  }
  else {
    poVar2 = std::operator<<((ostream *)(h + 0x10),"<META http-equiv=\'refresh\' content=2;URL=\'");
    std::operator<<(poVar2,"/\'>");
    HTML::CENTER::CENTER
              ((CENTER *)&h2.super_TAG.m_stream,
               (ostream *)
               (copy.m_parameters._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x10));
    HTML::TAG::text((TAG *)&h2.super_TAG.m_stream);
    HTML::H2::H2((H2 *)&a.super_TAG.m_stream,
                 (ostream *)
                 (copy.m_parameters._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x10));
    HTML::TAG::text((TAG *)&a.super_TAG.m_stream);
    HTML::A::A((A *)local_670,
               (ostream *)
               (copy.m_parameters._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x10));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_690,"/",&local_691);
    pTVar3 = &HTML::A::href((A *)local_670,&local_690)->super_TAG;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6b8,"Sessions",
               (allocator<char> *)((long)&center_1.super_TAG.m_stream + 7));
    HTML::TAG::text(pTVar3,&local_6b8);
    std::__cxx11::string::~string((string *)&local_6b8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&center_1.super_TAG.m_stream + 7));
    std::__cxx11::string::~string((string *)&local_690);
    std::allocator<char>::~allocator(&local_691);
    HTML::A::~A((A *)local_670);
    std::operator<<((ostream *)
                    (copy.m_parameters._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x10),
                    " have been refreshed");
    HTML::H2::~H2((H2 *)&a.super_TAG.m_stream);
    HTML::CENTER::~CENTER((CENTER *)&h2.super_TAG.m_stream);
  }
  HttpMessage::~HttpMessage((HttpMessage *)local_78);
  return;
}

Assistant:

void HttpConnection::processRefreshSessions
( const HttpMessage& request, std::stringstream& h, std::stringstream& b )
{
  try
  {
    HttpMessage copy = request;

    bool confirm = false;
    if( copy.hasParameter("confirm") && copy.getParameter("confirm") != "0" )
    {
      confirm = true;
      std::set<SessionID> sessions = Session::getSessions();
      std::set<SessionID>::iterator session;
      for( session = sessions.begin(); session != sessions.end(); ++session )
      Session::lookupSession( *session )->refresh();
      copy.removeParameter("confirm");
    }

    if( confirm )
    {
      h << "<META http-equiv='refresh' content=2;URL='" << "/'>";
      CENTER center(b); center.text();
      H2 h2(b); h2.text();
      { A a(b); a.href("/").text("Sessions"); }
      b << " have been refreshed";
    }
    else
    {
      { CENTER center(b); center.text();
        H2 h2(b); h2.text();
        b << "Are you sure you want to refresh all sessions ?";
      }
      { CENTER center(b); center.text();
        b << "[";
        { A a(b); a.href(request.toString() + "?confirm=1").text("YES, refresh sessions"); }
        b << "]" << NBSP << "[";
        { A a(b); a.href("/").text("NO, do not refresh sessions"); }
        b << "]";
      }
    }
  }
  catch( std::exception& e )
  {
    b << e.what();
  }
}